

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O0

Am_Constraint * __thiscall am_CList::Remove_Dep(am_CList *this,CItem *item)

{
  CItem *pCVar1;
  CItem *pCVar2;
  Am_Constraint *pAVar3;
  Am_Constraint *value;
  CItem *next;
  CItem *prev;
  CItem *item_local;
  am_CList *this_local;
  
  pCVar1 = (item->field_1).prev;
  pCVar2 = item->next;
  if (pCVar1 == (CItem *)0x0) {
    this->head = pCVar2;
  }
  else {
    pCVar1->next = pCVar2;
  }
  if (pCVar2 != (CItem *)0x0) {
    (pCVar2->field_1).prev = pCVar1;
  }
  pAVar3 = item->value;
  (item->field_1).prev = (CItem *)0x0;
  item->next = (CItem *)0x0;
  item->value = (Am_Constraint *)0x0;
  if (item != (CItem *)0x0) {
    CItem::operator_delete(item,0x18);
  }
  return pAVar3;
}

Assistant:

Am_Constraint *
am_CList::Remove_Dep(CItem *item)
{
  CItem *prev = item->prev;
  CItem *next = item->next;
  if (prev)
    prev->next = next;
  else
    head = next;
  if (next)
    next->prev = prev;
  Am_Constraint *value = item->value;
  item->prev = nullptr;
  item->next = nullptr;
  item->value = nullptr;
  delete item;
  return value;
}